

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int fts5Porter_Ostar(char *zStem,int nStem)

{
  uint uVar1;
  ulong uVar2;
  byte bVar3;
  bool bVar4;
  bool bVar5;
  byte bVar6;
  
  uVar1 = 0;
  if (0 < nStem && (byte)(zStem[(long)nStem + -1] + 0x86U) < 0xfd) {
    uVar2 = 0;
    bVar3 = 0;
    bVar4 = false;
    do {
      bVar6 = zStem[uVar2] + 0x9f;
      bVar6 = bVar6 >> 1 | bVar6 * -0x80;
      if ((10 < bVar6) || (bVar5 = false, (0x495U >> (bVar6 & 0x1f) & 1) == 0)) {
        bVar5 = zStem[uVar2] != 'y' || bVar4 == false;
      }
      bVar3 = bVar5 + bVar3 * '\x02';
      uVar2 = uVar2 + 1;
      bVar4 = bVar5;
    } while ((uint)nStem != uVar2);
    uVar1 = (uint)((bVar3 & 7) == 5);
  }
  return uVar1;
}

Assistant:

static int fts5Porter_Ostar(char *zStem, int nStem){
  if( zStem[nStem-1]=='w' || zStem[nStem-1]=='x' || zStem[nStem-1]=='y' ){
    return 0;
  }else{
    int i;
    int mask = 0;
    int bCons = 0;
    for(i=0; i<nStem; i++){
      bCons = !fts5PorterIsVowel(zStem[i], bCons);
      assert( bCons==0 || bCons==1 );
      mask = (mask << 1) + bCons;
    }
    return ((mask & 0x0007)==0x0005);
  }
}